

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_deleteRows(HModel *this,int firstrow,int lastrow)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int row_1;
  int el;
  int fmEl;
  int col;
  int nnz;
  int row;
  int rowStep;
  HModel *in_stack_ffffffffffffffa0;
  int local_28;
  int local_20;
  value_type local_1c;
  uint local_18;
  
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n",(ulong)in_ESI,(ulong)in_EDX);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  iVar3 = (in_EDX - in_ESI) + 1;
  for (local_18 = in_ESI; (int)local_18 < (int)in_EDX; local_18 = local_18 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                        (long)(int)(iVar3 + local_18));
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),
                        (long)(int)local_18);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                        (long)(int)(iVar3 + local_18));
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                        (long)(int)local_18);
    *pvVar4 = vVar1;
  }
  local_1c = 0;
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x60c); local_20 = local_20 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_20);
    local_28 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_20);
    *pvVar5 = local_1c;
    while( true ) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(local_20 + 1)
                         );
      if (*pvVar5 <= local_28) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_28);
      iVar2 = *pvVar5;
      if ((iVar2 < (int)in_ESI) || ((int)in_EDX < iVar2)) {
        if (iVar2 < (int)in_ESI) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_1c);
          *pvVar5 = iVar2;
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_1c);
          *pvVar5 = iVar2 - iVar3;
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_28);
        in_stack_ffffffffffffffa0 = (HModel *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_1c);
        *pvVar4 = (value_type)in_stack_ffffffffffffffa0;
        local_1c = local_1c + 1;
      }
      local_28 = local_28 + 1;
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                      (long)*(int *)(in_RDI + 0x60c));
  *pvVar5 = local_1c;
  *(int *)(in_RDI + 0x610) = *(int *)(in_RDI + 0x610) - iVar3;
  *(int *)(in_RDI + 0x614) = *(int *)(in_RDI + 0x614) - iVar3;
  mlFg_Update(in_stack_ffffffffffffffa0,local_1c);
  return;
}

Assistant:

void HModel::util_deleteRows(int firstrow, int lastrow) {
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  assert(firstrow <= lastrow);
#ifdef JAJH_dev
  printf("Called model.util_deleteRows(firstrow=%d, lastrow=%d)\n", firstrow, lastrow);cout << flush;
#endif
  int rowStep = lastrow-firstrow+1;
  for (int row = firstrow; row < lastrow; row++) {
    rowLower[row] = rowLower[rowStep+row];
    rowUpper[row] = rowUpper[rowStep+row];
    //    rowScale[row] = rowScale[rowStep+row];
  }

  int nnz = 0;
  for (int col = 0; col < numCol; col++) {
    int fmEl = Astart[col];
    Astart[col] = nnz;
    for (int el = fmEl; el < Astart[col+1]; el++) {
      int row = Aindex[el];
      if (row < firstrow || row > lastrow) {
	if (row < firstrow) {
	  Aindex[nnz] = row;
	} else {
	  Aindex[nnz] = row-rowStep;
	}
	Avalue[nnz] = Avalue[el];
	nnz++;
      }
    }
  }
  Astart[numCol] = nnz;

  //Reduce the number of rows and total number of variables in the model
  numRow -= rowStep;
  numTot -= rowStep;

  //Determine consequences for basis when deleting rows
  mlFg_Update(mlFg_action_DelRows);
 
}